

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O0

void Dar_BalancePermute(Aig_Man_t *p,Vec_Ptr_t *vSuper,int LeftBound,int fExor)

{
  int iVar1;
  int i_00;
  Aig_Obj_t *p_00;
  Aig_Obj_t *p_01;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Type_t Type;
  int local_48;
  int i;
  int RightBound;
  Aig_Obj_t *pGhost;
  Aig_Obj_t *pObj3;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj1;
  int fExor_local;
  int LeftBound_local;
  Vec_Ptr_t *vSuper_local;
  Aig_Man_t *p_local;
  
  iVar1 = Vec_PtrSize(vSuper);
  i_00 = iVar1 + -2;
  if (i_00 < LeftBound) {
    __assert_fail("LeftBound <= RightBound",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darBalance.c"
                  ,0x118,"void Dar_BalancePermute(Aig_Man_t *, Vec_Ptr_t *, int, int)");
  }
  if (LeftBound != i_00) {
    p_00 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,iVar1 + -1);
    p_01 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,i_00);
    pAVar2 = Aig_Regular(p_00);
    if ((pAVar2 != p->pConst1) && (pAVar2 = Aig_Regular(p_01), pAVar2 != p->pConst1)) {
      pAVar2 = Aig_Regular(p_00);
      pAVar3 = Aig_Regular(p_01);
      local_48 = i_00;
      if (pAVar2 != pAVar3) {
        for (; LeftBound <= local_48; local_48 = local_48 + -1) {
          pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,local_48);
          pAVar3 = Aig_Regular(pAVar2);
          if (pAVar3 == p->pConst1) {
            Vec_PtrWriteEntry(vSuper,local_48,p_01);
            Vec_PtrWriteEntry(vSuper,i_00,pAVar2);
            return;
          }
          pAVar3 = Aig_Regular(p_00);
          pAVar4 = Aig_Regular(pAVar2);
          if (pAVar3 == pAVar4) {
            if (pAVar2 == p_01) {
              return;
            }
            Vec_PtrWriteEntry(vSuper,local_48,p_01);
            Vec_PtrWriteEntry(vSuper,i_00,pAVar2);
            return;
          }
          Type = AIG_OBJ_AND;
          if (fExor != 0) {
            Type = AIG_OBJ_EXOR;
          }
          pAVar3 = Aig_ObjCreateGhost(p,p_00,pAVar2,Type);
          pAVar3 = Aig_TableLookup(p,pAVar3);
          if (pAVar3 != (Aig_Obj_t *)0x0) {
            if (pAVar2 == p_01) {
              return;
            }
            Vec_PtrWriteEntry(vSuper,local_48,p_01);
            Vec_PtrWriteEntry(vSuper,i_00,pAVar2);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Dar_BalancePermute( Aig_Man_t * p, Vec_Ptr_t * vSuper, int LeftBound, int fExor )
{
    Aig_Obj_t * pObj1, * pObj2, * pObj3, * pGhost;
    int RightBound, i;
    // get the right bound
    RightBound = Vec_PtrSize(vSuper) - 2;
    assert( LeftBound <= RightBound );
    if ( LeftBound == RightBound )
        return;
    // get the two last nodes
    pObj1 = (Aig_Obj_t *)Vec_PtrEntry( vSuper, RightBound + 1 );
    pObj2 = (Aig_Obj_t *)Vec_PtrEntry( vSuper, RightBound     );
    if ( Aig_Regular(pObj1) == p->pConst1 || Aig_Regular(pObj2) == p->pConst1 || Aig_Regular(pObj1) == Aig_Regular(pObj2) )
        return;
    // find the first node that can be shared
    for ( i = RightBound; i >= LeftBound; i-- )
    {
        pObj3 = (Aig_Obj_t *)Vec_PtrEntry( vSuper, i );
        if ( Aig_Regular(pObj3) == p->pConst1 )
        {
            Vec_PtrWriteEntry( vSuper, i,          pObj2 );
            Vec_PtrWriteEntry( vSuper, RightBound, pObj3 );
            return;
        }
        if ( Aig_Regular(pObj1) == Aig_Regular(pObj3) )
        {
            if ( pObj3 == pObj2 )
                return;
            Vec_PtrWriteEntry( vSuper, i,          pObj2 );
            Vec_PtrWriteEntry( vSuper, RightBound, pObj3 );
            return;
        }
        pGhost = Aig_ObjCreateGhost( p, pObj1, pObj3, fExor? AIG_OBJ_EXOR : AIG_OBJ_AND );
        if ( Aig_TableLookup( p, pGhost ) )
        {
            if ( pObj3 == pObj2 )
                return;
            Vec_PtrWriteEntry( vSuper, i,          pObj2 );
            Vec_PtrWriteEntry( vSuper, RightBound, pObj3 );
            return;
        }
    }
/*
    // we did not find the node to share, randomize choice
    {
        int Choice = Aig_ManRandom(0) % (RightBound - LeftBound + 1);
        pObj3 = Vec_PtrEntry( vSuper, LeftBound + Choice );
        if ( pObj3 == pObj2 )
            return;
        Vec_PtrWriteEntry( vSuper, LeftBound + Choice, pObj2 );
        Vec_PtrWriteEntry( vSuper, RightBound,         pObj3 );
    }
*/
}